

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fxuUpdate.c
# Opt level: O1

void Fxu_UpdateCleanOldDoubles(Fxu_Matrix *p,Fxu_Double *pDiv,Fxu_Cube *pCube)

{
  Fxu_Pair *pLink;
  Fxu_Double *pDiv_00;
  Fxu_Var *pFVar1;
  long lVar2;
  
  if (pCube->pVar->ppPairs == (Fxu_Pair ***)0x0) {
    return;
  }
  pFVar1 = pCube->pVar;
  if (0 < pFVar1->nCubes) {
    lVar2 = 0;
    do {
      pLink = pFVar1->ppPairs[pCube->iCube][lVar2];
      if ((pLink != (Fxu_Pair *)0x0) && (pDiv_00 = pLink->pDiv, pDiv_00 != pDiv)) {
        Fxu_ListDoubleDelPair(pDiv_00,pLink);
        if ((pDiv_00->lPairs).nItems == 0) {
          if (pDiv_00->Weight != pLink->nBase + -1) {
            __assert_fail("pDivCur->Weight == pPair->nBase - 1",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/fxu/fxuUpdate.c"
                          ,0x2b7,
                          "void Fxu_UpdateCleanOldDoubles(Fxu_Matrix *, Fxu_Double *, Fxu_Cube *)");
          }
          Fxu_HeapDoubleDelete(p->pHeapDouble,pDiv_00);
          Fxu_MatrixDelDivisor(p,pDiv_00);
        }
        else {
          pDiv_00->Weight = (pDiv_00->Weight - (pLink->nLits1 + pLink->nLits2 + pLink->nBase)) + 1;
          Fxu_HeapDoubleUpdate(p->pHeapDouble,pDiv_00);
        }
        Fxu_MemRecycle(p,(char *)pLink,0x40);
      }
      lVar2 = lVar2 + 1;
      pFVar1 = pCube->pVar;
    } while (lVar2 < pFVar1->nCubes);
  }
  Fxu_PairClearStorage(pCube);
  return;
}

Assistant:

void Fxu_UpdateCleanOldDoubles( Fxu_Matrix * p, Fxu_Double * pDiv, Fxu_Cube * pCube )
{
    Fxu_Double * pDivCur;
	Fxu_Pair * pPair;
    int i;

    // if the cube is a recently introduced one
    // it does not have pairs allocated
    // in this case, there is nothing to update
    if ( pCube->pVar->ppPairs == NULL )
        return;

	// go through all the pairs of this cube
	Fxu_CubeForEachPair( pCube, pPair, i )
	{
         // get the divisor of this pair
        pDivCur = pPair->pDiv;
		// skip the current divisor
		if ( pDivCur == pDiv )
			continue;
		// remove this pair
	    Fxu_ListDoubleDelPair( pDivCur, pPair );	
		// the divisor may have become useless by now
		if ( pDivCur->lPairs.nItems == 0 )
        {
            assert( pDivCur->Weight == pPair->nBase - 1 );
      		Fxu_HeapDoubleDelete( p->pHeapDouble, pDivCur );
			Fxu_MatrixDelDivisor( p, pDivCur );
        }
        else
        {
	        // update the divisor's weight
	        pDivCur->Weight -= pPair->nLits1 + pPair->nLits2 - 1 + pPair->nBase;
      	    Fxu_HeapDoubleUpdate( p->pHeapDouble, pDivCur );
        }
		MEM_FREE_FXU( p, Fxu_Pair, 1, pPair );
	}
	// finally erase all the pair info associated with this cube
	Fxu_PairClearStorage( pCube );
}